

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformanceTesting.cpp
# Opt level: O2

void dijkstraPerfTest(Graph<std::pair<double,_double>_> *graph)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<Path_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/PerformanceTesting.cpp:37:33)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<Path_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/PerformanceTesting.cpp:37:33)>
             ::_M_manager;
  local_28._M_unused._M_object = graph;
  shortestPathPerfTest(graph,(function<Path_(int,_int)> *)&local_28,'\0');
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void dijkstraPerfTest(Graph<coordinates> &graph) {
    shortestPathPerfTest(graph, [&](int s, int d) { return graph.dijkstraShortestPath(s, d); }, 'D');
}